

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_kpr_mri.c
# Opt level: O0

int fs(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  char *in_RCX;
  int in_EDX;
  undefined4 in_register_00000014;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  double t_00;
  double extraout_XMM0_Qa;
  double dVar6;
  sunrealtype sVar7;
  sunrealtype sVar8;
  sunrealtype tmp2;
  sunrealtype tmp1;
  sunrealtype v;
  sunrealtype u;
  sunrealtype e;
  sunrealtype G;
  sunrealtype *rpar;
  void *in_stack_ffffffffffffff88;
  
  pdVar5 = (double *)CONCAT44(in_register_00000014,in_EDX);
  dVar1 = *pdVar5;
  dVar2 = pdVar5[2];
  dVar3 = **(double **)(*in_RDI + 0x10);
  dVar4 = *(double *)(*(long *)(*in_RDI + 0x10) + 8);
  t_00 = dVar3 * dVar3 + -1.0;
  r(pdVar5,in_RSI,in_EDX,in_RCX,in_R8D,in_R9D);
  dVar6 = t_00 - extraout_XMM0_Qa;
  sVar7 = s(t_00,in_stack_ffffffffffffff88);
  sVar8 = rdot(t_00,in_stack_ffffffffffffff88);
  **(double **)(*in_RSI + 0x10) =
       dVar1 * (dVar6 / (dVar3 * 2.0)) + dVar2 * (((dVar4 * dVar4 + -2.0) - sVar7) / (dVar4 * 2.0))
       + sVar8 / (dVar3 * 2.0);
  *(undefined8 *)(*(long *)(*in_RSI + 0x10) + 8) = 0;
  return 0;
}

Assistant:

static int fs(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype* rpar   = (sunrealtype*)user_data;
  const sunrealtype G = rpar[0];
  const sunrealtype e = rpar[2];
  const sunrealtype u = NV_Ith_S(y, 0);
  const sunrealtype v = NV_Ith_S(y, 1);
  sunrealtype tmp1, tmp2;

  /* fill in the RHS function:
     [G e]*[(-1+u^2-r(t))/(2*u))] + [rdot(t)/(2*u)]
     [0 0] [(-2+v^2-s(t))/(2*v)]    [      0      ] */
  tmp1              = (-ONE + u * u - r(t, rpar)) / (TWO * u);
  tmp2              = (-TWO + v * v - s(t, rpar)) / (TWO * v);
  NV_Ith_S(ydot, 0) = G * tmp1 + e * tmp2 + rdot(t, rpar) / (TWO * u);
  NV_Ith_S(ydot, 1) = ZERO;

  /* Return with success */
  return 0;
}